

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O2

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparatei
          (BlendMaskStateMachine *this,int idx,GLenum src_rgb,GLenum dst_rgb,GLenum src_a,
          GLenum dst_a)

{
  pointer pBVar1;
  
  (*this->gl->blendFuncSeparatei)(idx,src_rgb,dst_rgb,src_a,dst_a);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar1[idx].func_src_rgb = src_rgb;
  pBVar1[idx].func_src_a = src_a;
  pBVar1[idx].func_dst_rgb = dst_rgb;
  pBVar1[idx].func_dst_a = dst_a;
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparatei(int idx, glw::GLenum src_rgb,
																		  glw::GLenum dst_rgb, glw::GLenum src_a,
																		  glw::GLenum dst_a)
{
	gl.blendFuncSeparatei(idx, src_rgb, dst_rgb, src_a, dst_a);
	state[idx].func_src_rgb = src_rgb;
	state[idx].func_src_a   = src_a;
	state[idx].func_dst_rgb = dst_rgb;
	state[idx].func_dst_a   = dst_a;
}